

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

BasicBlock * __thiscall
FlowGraph::AddBlock(FlowGraph *this,Instr *firstInstr,Instr *lastInstr,BasicBlock *nextBlock,
                   BasicBlock *prevBlock)

{
  IRKind IVar1;
  char cVar2;
  OpCode OVar3;
  Kind KVar4;
  uint uVar5;
  Instr *pIVar6;
  long *plVar7;
  long lVar8;
  Type pBVar9;
  code *pcVar10;
  bool bVar11;
  BOOLEAN BVar12;
  BOOL BVar13;
  LabelInstr *this_00;
  BasicBlock *pBVar14;
  undefined4 *puVar15;
  BasicBlock *blockSucc;
  MultiBranchInstr *pMVar16;
  LabelInstr *pLVar17;
  long *plVar18;
  BVSparseNode *pBVar19;
  BranchInstr *this_01;
  char *message;
  long lVar20;
  ulong uVar21;
  char *error;
  int iVar22;
  BasicBlock **ppBVar23;
  uint lineNumber;
  BVSparseNode *pBVar24;
  BranchDictionary *branchDictionary;
  BVSparse<Memory::JitArenaAllocator> local_68;
  BasicBlock *local_48;
  BasicBlock *local_40;
  BranchInstr *local_38;
  
  this_00 = (LabelInstr *)firstInstr;
  if ((firstInstr->m_kind != InstrKindLabel) && (firstInstr->m_kind != InstrKindProfiledLabel)) {
    local_48 = prevBlock;
    this_00 = IR::LabelInstr::New(Label,firstInstr->m_func,false);
    IR::Instr::SetByteCodeOffset(&this_00->super_Instr,firstInstr);
    if (firstInstr->m_kind == InstrKindEntry) {
      IR::Instr::InsertAfter(firstInstr,&this_00->super_Instr);
      prevBlock = local_48;
    }
    else {
      IR::Instr::InsertBefore(firstInstr,&this_00->super_Instr);
      prevBlock = local_48;
    }
  }
  pBVar14 = this_00->m_block;
  if (pBVar14 == (BasicBlock *)0x0) {
    pBVar14 = BasicBlock::New(this);
    if ((pBVar14 != (BasicBlock *)0x0) && (this_00->m_block != (BasicBlock *)0x0)) {
      AssertCount = AssertCount + 1;
      local_48 = prevBlock;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                          ,0x2c8,"(this->m_block == nullptr || block == nullptr)",
                          "Overwriting existing block pointer");
      if (!bVar11) goto LAB_00416cf5;
      *puVar15 = 0;
      prevBlock = local_48;
    }
    this_00->m_block = pBVar14;
    if (this->tailBlock == (BasicBlock *)0x0) {
      this->tailBlock = pBVar14;
    }
  }
  IVar1 = lastInstr->m_kind;
  local_40 = pBVar14;
  if (IVar1 == InstrKindBranch) {
LAB_004167d9:
    pIVar6 = lastInstr[1].m_next;
    cVar2 = *(char *)((long)&lastInstr[1]._vptr_Instr + 1);
    local_38 = (BranchInstr *)lastInstr;
    if (pIVar6 == (Instr *)0x0) {
      if (cVar2 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        error = "(m_isMultiBranch)";
        message = "m_isMultiBranch";
        lineNumber = 0x20e;
        goto LAB_0041689b;
      }
    }
    else if (cVar2 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      error = "(!m_isMultiBranch)";
      message = "!m_isMultiBranch";
      lineNumber = 0x209;
LAB_0041689b:
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                          ,lineNumber,error,message);
      if (!bVar11) goto LAB_00416cf5;
      *puVar15 = 0;
    }
    lastInstr = &local_38->super_Instr;
    if (pIVar6 == (Instr *)0x0) {
      local_48 = prevBlock;
      pMVar16 = IR::BranchInstr::AsMultiBrInstr(local_38);
      local_68.alloc = ((pMVar16->super_BranchInstr).super_Instr.m_func)->m_alloc;
      local_68.lastUsedNodePrevNextField = &local_68.head;
      local_68.head = (BVSparseNode *)0x0;
      local_68.lastFoundIndex = (Type_conflict)0x0;
      plVar7 = (long *)pMVar16->m_branchTargets;
      if (plVar7 != (long *)0x0) {
        KVar4 = pMVar16->m_kind;
        if ((KVar4 == IntJumpTable) || (KVar4 == SingleCharStrJumpTable)) {
          plVar18 = plVar7 + 1;
          lVar20 = pMVar16->m_baseCaseValue;
          lastInstr = &local_38->super_Instr;
          if (lVar20 <= pMVar16->m_lastCaseValue) {
            lVar8 = *plVar7;
            do {
              pLVar17 = *(LabelInstr **)(lVar8 + pMVar16->m_baseCaseValue * -8 + lVar20 * 8);
              BVar12 = BVSparse<Memory::JitArenaAllocator>::Test(&local_68,pLVar17->m_id);
              if (BVar12 == '\0') {
                BVSparse<Memory::JitArenaAllocator>::Set(&local_68,pLVar17->m_id);
                pBVar14 = SetBlockTargetAndLoopFlag(this,pLVar17);
                AddEdge(this,local_40,pBVar14);
              }
              lVar20 = lVar20 + 1;
              lastInstr = &local_38->super_Instr;
            } while (lVar20 <= pMVar16->m_lastCaseValue);
          }
        }
        else {
          if (KVar4 != StrDictionary) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar15 = 1;
            Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x435,"(false)","false");
            goto LAB_00416cf5;
          }
          plVar18 = plVar7 + 7;
          if (*(int *)((long)plVar7 + 0x1c) != 0) {
            uVar21 = 0;
            do {
              iVar22 = *(int *)(*plVar7 + uVar21 * 4);
              while (iVar22 != -1) {
                lVar20 = (long)iVar22;
                iVar22 = *(int *)(plVar7[1] + 8 + lVar20 * 0x18);
                pLVar17 = *(LabelInstr **)(plVar7[1] + lVar20 * 0x18);
                BVar12 = BVSparse<Memory::JitArenaAllocator>::Test(&local_68,pLVar17->m_id);
                if (BVar12 == '\0') {
                  BVSparse<Memory::JitArenaAllocator>::Set(&local_68,pLVar17->m_id);
                  pBVar14 = SetBlockTargetAndLoopFlag(this,pLVar17);
                  AddEdge(this,local_40,pBVar14);
                }
              }
              uVar21 = uVar21 + 1;
              lastInstr = &local_38->super_Instr;
            } while (uVar21 < *(uint *)((long)plVar7 + 0x1c));
          }
        }
        pLVar17 = (LabelInstr *)*plVar18;
        BVar12 = BVSparse<Memory::JitArenaAllocator>::Test(&local_68,pLVar17->m_id);
        if (BVar12 == '\0') {
          BVSparse<Memory::JitArenaAllocator>::Set(&local_68,pLVar17->m_id);
          pBVar14 = SetBlockTargetAndLoopFlag(this,pLVar17);
          AddEdge(this,local_40,pBVar14);
        }
      }
      prevBlock = local_48;
      if (local_68.head != (BVSparseNode *)0x0) {
        pBVar9 = local_68.head;
        pBVar24 = (local_68.alloc)->bvFreeList;
        do {
          pBVar19 = pBVar9;
          pBVar9 = pBVar19->next;
          pBVar19->next = pBVar24;
          pBVar24 = pBVar19;
        } while (pBVar9 != (Type)0x0);
        local_68.lastFoundIndex = (Type_conflict)0x0;
        (local_68.alloc)->bvFreeList = pBVar19;
        local_68.lastUsedNodePrevNextField = &local_68.head;
      }
LAB_00416b22:
      blockSucc = (BasicBlock *)0x0;
    }
    else {
      blockSucc = SetBlockTargetAndLoopFlag(this,local_38->m_branchTarget);
      OVar3 = (((BranchInstr *)lastInstr)->super_Instr).m_opcode;
      if (OVar3 < ADD) {
        bVar11 = OVar3 == MultiBr || OVar3 == Br;
      }
      else {
        bVar11 = LowererMD::IsUnconditionalBranch(lastInstr);
      }
      if (bVar11 == false) {
        pLVar17 = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel(lastInstr);
        IVar1 = (pLVar17->super_Instr).m_kind;
        if ((IVar1 == InstrKindProfiledLabel) || (IVar1 == InstrKindLabel)) {
          SetBlockTargetAndLoopFlag(this,pLVar17);
        }
      }
    }
LAB_00416b25:
    if (blockSucc != (BasicBlock *)0x0) {
      AddEdge(this,local_40,blockSucc);
    }
  }
  else {
    if (IVar1 == InstrKindExit) {
LAB_00416837:
      if (lastInstr->m_opcode != Ret) goto LAB_00416b22;
      blockSucc = (BasicBlock *)0x0;
      if (pBVar14 != this->tailBlock) {
        blockSucc = this->tailBlock;
      }
      goto LAB_00416b25;
    }
    if ((lastInstr->m_opcode - 0x23 < 3) || (lastInstr->m_opcode - 0x173 < 2)) {
      if (IVar1 == InstrKindBranch) goto LAB_004167d9;
      goto LAB_00416837;
    }
  }
  if ((((BranchInstr *)lastInstr)->super_Instr).m_kind == InstrKindBranch) {
    OVar3 = (((BranchInstr *)lastInstr)->super_Instr).m_opcode;
    if (OVar3 < ADD) {
      bVar11 = OVar3 == MultiBr || OVar3 == Br;
    }
    else {
      bVar11 = LowererMD::IsUnconditionalBranch(lastInstr);
    }
    if (bVar11 != false) goto LAB_00416c59;
  }
  bVar11 = OpCodeAttr::HasFallThrough((((BranchInstr *)lastInstr)->super_Instr).m_opcode);
  if (bVar11) {
    BVar13 = Func::HasTry(this->func);
    if ((BVar13 == 0) && ((((BranchInstr *)lastInstr)->super_Instr).m_kind != InstrKindBranch)) {
      pLVar17 = (LabelInstr *)(((BranchInstr *)lastInstr)->super_Instr).m_next;
      IVar1 = (pLVar17->super_Instr).m_kind;
      if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
        AssertCount = AssertCount + 1;
        local_38 = (BranchInstr *)lastInstr;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                            ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
        if (!bVar11) {
LAB_00416cf5:
          pcVar10 = (code *)invalidInstructionException();
          (*pcVar10)();
        }
        *puVar15 = 0;
        lastInstr = &local_38->super_Instr;
      }
      this_01 = IR::BranchInstr::New(Br,pLVar17,(((BranchInstr *)lastInstr)->super_Instr).m_func);
      IR::Instr::SetByteCodeOffset
                (&this_01->super_Instr,(((BranchInstr *)lastInstr)->super_Instr).m_next);
      IR::Instr::InsertAfter(lastInstr,&this_01->super_Instr);
    }
    AddEdge(this,local_40,nextBlock);
  }
LAB_00416c59:
  uVar5 = this->blockCount;
  this->blockCount = uVar5 + 1;
  local_40->number = uVar5;
  local_40->firstInstr = &this_00->super_Instr;
  if (prevBlock == (BasicBlock *)0x0) {
    pBVar14 = this->blockList;
    if (pBVar14 != (BasicBlock *)0x0) {
      pBVar14->prev = local_40;
    }
    ppBVar23 = &this->blockList;
    local_40->next = pBVar14;
  }
  else {
    prevBlock->next = local_40;
    local_40->prev = prevBlock;
    local_40->next = nextBlock;
    ppBVar23 = &nextBlock->prev;
  }
  *ppBVar23 = local_40;
  return local_40;
}

Assistant:

BasicBlock *
FlowGraph::AddBlock(
    IR::Instr * firstInstr,
    IR::Instr * lastInstr,
    BasicBlock * nextBlock,
    BasicBlock *prevBlock)
{
    BasicBlock * block;
    IR::LabelInstr * labelInstr;

    if (firstInstr->IsLabelInstr())
    {
        labelInstr = firstInstr->AsLabelInstr();
    }
    else
    {
        labelInstr = IR::LabelInstr::New(Js::OpCode::Label, firstInstr->m_func);
        labelInstr->SetByteCodeOffset(firstInstr);
        if (firstInstr->IsEntryInstr())
        {
            firstInstr->InsertAfter(labelInstr);
        }
        else
        {
            firstInstr->InsertBefore(labelInstr);
        }
        firstInstr = labelInstr;
    }

    block = labelInstr->GetBasicBlock();
    if (block == nullptr)
    {
        block = BasicBlock::New(this);
        labelInstr->SetBasicBlock(block);
        // Remember last block in function to target successor of RETs.
        if (!this->tailBlock)
        {
            this->tailBlock = block;
        }
    }

    // Hook up the successor edges
    if (lastInstr->EndsBasicBlock())
    {
        BasicBlock * blockTarget = nullptr;

        if (lastInstr->IsBranchInstr())
        {
            // Hook up a successor edge to the branch target.
            IR::BranchInstr * branchInstr = lastInstr->AsBranchInstr();

            if(branchInstr->IsMultiBranch())
            {
                BasicBlock * blockMultiBrTarget;

                IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsMultiBrInstr();

                multiBranchInstr->MapUniqueMultiBrLabels([&](IR::LabelInstr * labelInstr) -> void
                {
                    blockMultiBrTarget = SetBlockTargetAndLoopFlag(labelInstr);
                    this->AddEdge(block, blockMultiBrTarget);
                });
            }
            else
            {
                IR::LabelInstr * targetLabelInstr = branchInstr->GetTarget();
                blockTarget = SetBlockTargetAndLoopFlag(targetLabelInstr);
                if (branchInstr->IsConditional())
                {
                    IR::Instr *instrNext = branchInstr->GetNextRealInstrOrLabel();

                    if (instrNext->IsLabelInstr())
                    {
                        SetBlockTargetAndLoopFlag(instrNext->AsLabelInstr());
                    }
                }
            }
        }
        else if (lastInstr->m_opcode == Js::OpCode::Ret && block != this->tailBlock)
        {
            blockTarget = this->tailBlock;
        }

        if (blockTarget)
        {
            this->AddEdge(block, blockTarget);
        }
    }

    if (lastInstr->HasFallThrough())
    {
        // Add a branch to next instruction so that we don't have to update the flow graph
        // when the glob opt tries to insert instructions.
        // We don't run the globopt with try/catch, don't need to insert branch to next for fall through blocks.
        if (!this->func->HasTry() && !lastInstr->IsBranchInstr())
        {
            IR::BranchInstr * instr = IR::BranchInstr::New(Js::OpCode::Br,
                lastInstr->m_next->AsLabelInstr(), lastInstr->m_func);
            instr->SetByteCodeOffset(lastInstr->m_next);
            lastInstr->InsertAfter(instr);
            lastInstr = instr;
        }
        this->AddEdge(block, nextBlock);
    }

    block->SetBlockNum(this->blockCount++);
    block->SetFirstInstr(firstInstr);
    block->SetLastInstr(lastInstr);

    if (!prevBlock)
    {
        if (this->blockList)
        {
            this->blockList->prev = block;
        }
        block->next = this->blockList;
        this->blockList = block;
    }
    else
    {
        prevBlock->next = block;
        block->prev = prevBlock;
        block->next = nextBlock;
        nextBlock->prev = block;
    }
    return block;
}